

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

int32_t BinaryenConstGetValueI64High(BinaryenExpressionRef expr)

{
  int64_t iVar1;
  
  if (expr->_id == ConstId) {
    iVar1 = wasm::Literal::geti64((Literal *)(expr + 1));
    return (int32_t)((ulong)iVar1 >> 0x20);
  }
  __assert_fail("expression->is<Const>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xad9,"int32_t BinaryenConstGetValueI64High(BinaryenExpressionRef)");
}

Assistant:

int32_t BinaryenConstGetValueI64High(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return (int32_t)(static_cast<Const*>(expression)->value.geti64() >> 32);
}